

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Generator * kratos::Const::const_gen(void)

{
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> local_30;
  char local_20 [8];
  
  if (const_generator_ == (Generator *)0x0) {
    local_20[0] = '\0';
    local_20[1] = '\0';
    local_20[2] = '\0';
    local_20[3] = '\0';
    local_20[4] = '\0';
    local_20[5] = '\0';
    local_20[6] = '\0';
    local_20[7] = '\0';
    std::make_shared<kratos::Generator,decltype(nullptr),char_const(&)[1]>
              (&local_30._M_ptr,(char (*) [1])local_20);
    std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)&const_generator_,
               &local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return const_generator_;
}

Assistant:

Generator *Const::const_gen() {
    if (!const_generator_) const_generator_ = std::make_shared<Generator>(nullptr, "");
    return const_generator_.get();
}